

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void xmlCatalogFreeLocal(void *catalogs)

{
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  if (catalogs != (void *)0x0) {
    xmlFreeCatalogEntryList((xmlCatalogEntryPtr)catalogs);
    return;
  }
  return;
}

Assistant:

void
xmlCatalogFreeLocal(void *catalogs) {
    xmlCatalogEntryPtr catal;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal != NULL)
	xmlFreeCatalogEntryList(catal);
}